

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_LevelMixer.cpp
# Opt level: O0

int LevelMixer::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  float fVar1;
  int local_64;
  uint local_60;
  int i_1;
  uint n;
  int i;
  float gains [8];
  Data *data;
  int outchannels_local;
  int inchannels_local;
  uint length_local;
  float *outbuffer_local;
  float *inbuffer_local;
  UnityAudioEffectState *state_local;
  
  gains._24_8_ = UnityAudioEffectState::GetEffectData<LevelMixer::EffectData>(state);
  for (i_1 = 0; i_1 < inchannels; i_1 = i_1 + 1) {
    fVar1 = powf(10.0,*(float *)(gains._24_8_ + (long)i_1 * 4) * 0.05);
    (&n)[i_1] = (uint)fVar1;
  }
  for (local_60 = 0; local_60 < length; local_60 = local_60 + 1) {
    for (local_64 = 0; local_64 < inchannels; local_64 = local_64 + 1) {
      outbuffer[local_60 * inchannels + local_64] =
           inbuffer[local_60 * inchannels + local_64] * (float)(&n)[local_64];
    }
  }
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData::Data* data = &state->GetEffectData<EffectData>()->data;

        float gains[8];
        for (int i = 0; i < inchannels; i++)
            gains[i] = powf(10.0f, data->p[P_GAIN1 + i] * 0.05f);

        for (unsigned int n = 0; n < length; n++)
            for (int i = 0; i < inchannels; i++)
                outbuffer[n * inchannels + i] = inbuffer[n * inchannels + i] * gains[i];

        return UNITY_AUDIODSP_OK;
    }